

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_skipdata.c
# Opt level: O1

int main(void)

{
  char *pcVar1;
  uchar *buffer;
  cs_err cVar2;
  size_t count;
  long lVar3;
  size_t sVar4;
  long lVar5;
  csh handle;
  cs_insn *insn;
  cs_opt_skipdata skipdata_callback;
  cs_opt_skipdata skipdata;
  csh local_158;
  cs_insn *local_150;
  cs_arch local_148 [2];
  char *local_140;
  size_t local_138;
  char *local_130;
  cs_opt_type local_128 [4];
  size_t local_118 [2];
  char *local_108;
  undefined8 local_100;
  char *local_f8;
  undefined8 local_f0;
  undefined4 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  char *local_d0;
  undefined8 local_c8;
  char *local_c0;
  undefined8 local_b8;
  undefined4 local_b0;
  char **local_a8;
  undefined8 local_a0;
  char *local_98;
  undefined8 local_90;
  char *local_88;
  undefined8 local_80;
  undefined4 local_78;
  char **local_70;
  char *local_68;
  code *pcStack_60;
  undefined8 local_58;
  char *local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  local_a8 = &local_48;
  local_38 = 0;
  local_48 = "db";
  uStack_40 = 0;
  local_70 = &local_68;
  local_58 = 0;
  local_68 = "db";
  pcStack_60 = mycallback;
  local_148[0] = CS_ARCH_X86;
  local_148[1] = CS_ARCH_PPC;
  local_140 = anon_var_dwarf_45;
  local_138 = 0xf;
  local_130 = "X86 32 (Intel syntax) - Skip data";
  local_128[0] = 0;
  local_128[1] = 0;
  local_128[2] = 0;
  local_118[0] = 0;
  local_118[1] = 0;
  local_108 = anon_var_dwarf_71;
  local_100 = 0x28;
  local_f8 = "Arm - Skip data";
  local_f0 = 0;
  local_e8 = 0;
  local_e0 = 0;
  local_d8 = 0x400000003;
  local_d0 = anon_var_dwarf_45;
  local_c8 = 0xf;
  local_c0 = "X86 32 (Intel syntax) - Skip data with custom mnemonic";
  local_b8 = 0;
  local_b0 = 6;
  local_a0 = 0;
  local_98 = anon_var_dwarf_71;
  local_90 = 0x28;
  local_88 = "Arm - Skip data with callback";
  local_80 = 0;
  local_78 = 6;
  lVar5 = 0;
  do {
    puts("****************");
    pcVar1 = (&local_130)[lVar5 * 7];
    printf("Platform: %s\n",pcVar1);
    cVar2 = cs_open(local_148[lVar5 * 0xe],local_148[lVar5 * 0xe + 1],&local_158);
    if (cVar2 == CS_ERR_OK) {
      if (local_128[lVar5 * 0xe] != 0) {
        cs_option(local_158,local_128[lVar5 * 0xe],(ulong)local_128[lVar5 * 0xe + 1]);
      }
      cs_option(local_158,CS_OPT_SKIPDATA,3);
      cs_option(local_158,local_128[lVar5 * 0xeU + 2],local_118[lVar5 * 7]);
      buffer = (uchar *)(&local_140)[lVar5 * 7];
      sVar4 = (&local_138)[lVar5 * 7];
      count = cs_disasm(local_158,buffer,sVar4,0x1000,0,&local_150);
      if (count == 0) {
        puts("****************");
        printf("Platform: %s\n",pcVar1);
        print_string_hex(buffer,sVar4);
        puts("ERROR: Failed to disasm given code!");
      }
      else {
        print_string_hex(buffer,sVar4);
        puts("Disasm:");
        lVar3 = 0x22;
        sVar4 = count;
        do {
          printf("0x%lx:\t%s\t\t%s\n",*(undefined8 *)(local_150->bytes + lVar3 + -0x2c),
                 local_150->bytes + lVar3 + -0x12);
          lVar3 = lVar3 + 0xf0;
          sVar4 = sVar4 - 1;
        } while (sVar4 != 0);
        printf("0x%lx:\n",(ulong)local_150[count - 1].size + local_150[count - 1].address);
        cs_free(local_150,count);
      }
      putchar(10);
      cs_close(&local_158);
    }
    else {
      printf("Failed on cs_open() with error returned: %u\n",(ulong)cVar2);
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 != 4);
  return 0;
}

Assistant:

static void test()
{
#define X86_CODE32 "\x8d\x4c\x32\x08\x01\xd8\x81\xc6\x34\x12\x00\x00\x00\x91\x92"
#define RANDOM_CODE "\xed\x00\x00\x00\x00\x1a\x5a\x0f\x1f\xff\xc2\x09\x80\x00\x00\x00\x07\xf7\xeb\x2a\xff\xff\x7f\x57\xe3\x01\xff\xff\x7f\x57\xeb\x00\xf0\x00\x00\x24\xb2\x4f\x00\x78"

	cs_opt_skipdata skipdata = {
		// rename default "data" instruction from ".byte" to "db"
		"db",
	};

	cs_opt_skipdata skipdata_callback = {
		"db",
		&mycallback,
	};

	struct platform platforms[] = {
		{
			CS_ARCH_X86,
			CS_MODE_32,
			(unsigned char*)X86_CODE32,
			sizeof(X86_CODE32) - 1,
			"X86 32 (Intel syntax) - Skip data",
		},
		{
			CS_ARCH_ARM,
			CS_MODE_ARM,
			(unsigned char*)RANDOM_CODE,
			sizeof(RANDOM_CODE) - 1,
			"Arm - Skip data",
		},
		{
			CS_ARCH_X86,
			CS_MODE_32,
			(unsigned char*)X86_CODE32,
			sizeof(X86_CODE32) - 1,
			"X86 32 (Intel syntax) - Skip data with custom mnemonic",
			0, 0,
			CS_OPT_SKIPDATA_SETUP,
			(size_t) &skipdata,
		},
		{
			CS_ARCH_ARM,
			CS_MODE_ARM,
			(unsigned char*)RANDOM_CODE,
			sizeof(RANDOM_CODE) - 1,
			"Arm - Skip data with callback",
			0, 0,
			CS_OPT_SKIPDATA_SETUP,
			(size_t) &skipdata_callback,
		},
	};

	csh handle;
	uint64_t address = 0x1000;
	cs_insn *insn;
	cs_err err;
	int i;
	size_t count;

	for (i = 0; i < sizeof(platforms)/sizeof(platforms[0]); i++) {
		printf("****************\n");
		printf("Platform: %s\n", platforms[i].comment);
		err = cs_open(platforms[i].arch, platforms[i].mode, &handle);
		if (err) {
			printf("Failed on cs_open() with error returned: %u\n", err);
			continue;
		}

		if (platforms[i].opt_type)
			cs_option(handle, platforms[i].opt_type, platforms[i].opt_value);

		// turn on SKIPDATA mode
		cs_option(handle, CS_OPT_SKIPDATA, CS_OPT_ON);
		cs_option(handle, platforms[i].opt_skipdata, platforms[i].skipdata);

		count = cs_disasm(handle, platforms[i].code, platforms[i].size, address, 0, &insn);
		if (count) {
			size_t j;

			print_string_hex(platforms[i].code, platforms[i].size);
			printf("Disasm:\n");

			for (j = 0; j < count; j++) {
				printf("0x%"PRIx64":\t%s\t\t%s\n",
						insn[j].address, insn[j].mnemonic, insn[j].op_str);
			}

			// print out the next offset, after the last insn
			printf("0x%"PRIx64":\n", insn[j-1].address + insn[j-1].size);

			// free memory allocated by cs_disasm()
			cs_free(insn, count);
		} else {
			printf("****************\n");
			printf("Platform: %s\n", platforms[i].comment);
			print_string_hex(platforms[i].code, platforms[i].size);
			printf("ERROR: Failed to disasm given code!\n");
		}

		printf("\n");

		cs_close(&handle);
	}
}